

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

void * vector_get(Vector *vector,size_t index)

{
  void *pvVar1;
  
  if (vector == (Vector *)0x0) {
    __assert_fail("vector != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/vector.c"
                  ,0xe9,"void *vector_get(Vector *, size_t)");
  }
  if (index < vector->size) {
    if (vector->element_size == 0) {
      pvVar1 = (void *)0x0;
    }
    else {
      pvVar1 = (void *)(vector->element_size * index + (long)vector->data);
    }
    return pvVar1;
  }
  __assert_fail("index < vector->size",
                "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/vector.c"
                ,0xea,"void *vector_get(Vector *, size_t)");
}

Assistant:

void* vector_get(Vector* vector, size_t index) {
	assert(vector != NULL);
	assert(index < vector->size);

	if (vector == NULL) return NULL;
	if (vector->element_size == 0) return NULL;
	if (index >= vector->size) return NULL;

	return _vector_offset(vector, index);
}